

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool __thiscall
CLIntercept::overrideGetPlatformInfo
          (CLIntercept *this,cl_platform_id platform,cl_platform_info param_name,
          size_t param_value_size,void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  char *pcVar1;
  cl_int cVar2;
  bool bVar3;
  CLIntercept *this_00;
  char *ptr;
  size_t minor;
  size_t major;
  char *local_38;
  
  bVar3 = false;
  switch(param_name) {
  case 0x900:
    if ((this->m_Config).PlatformProfile._M_string_length != 0) {
      this_00 = (CLIntercept *)&(this->m_Config).PlatformProfile;
LAB_00171264:
      cVar2 = writeStringToMemory(this_00,param_value_size,(string *)this_00,param_value_size_ret,
                                  (char *)param_value);
      *errorCode = cVar2;
      goto LAB_00171279;
    }
    break;
  case 0x901:
    if ((this->m_Config).PlatformVersion._M_string_length != 0) {
      this_00 = (CLIntercept *)&(this->m_Config).PlatformVersion;
      goto LAB_00171264;
    }
    break;
  case 0x902:
    if ((this->m_Config).PlatformName._M_string_length != 0) {
      this_00 = (CLIntercept *)&(this->m_Config).PlatformName;
      goto LAB_00171264;
    }
    break;
  case 0x903:
    if ((this->m_Config).PlatformVendor._M_string_length != 0) {
      this_00 = (CLIntercept *)&(this->m_Config).PlatformVendor;
      goto LAB_00171264;
    }
    break;
  case 0x904:
  case 0x905:
    goto switchD_00171183_caseD_904;
  case 0x906:
    if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
      local_38 = (char *)0x0;
      cVar2 = allocateAndGetPlatformInfoString(this,platform,0x901,&local_38);
      pcVar1 = local_38;
      *errorCode = cVar2;
      bVar3 = local_38 != (char *)0x0 && cVar2 == 0;
      if (local_38 != (char *)0x0 && cVar2 == 0) {
        major = 0;
        minor = 0;
        getMajorMinorVersionFromString(this,"OpenCL ",local_38,&major,&minor);
        cVar2 = 0;
        if (param_value != (void *)0x0) {
          if (param_value_size < 4) {
            cVar2 = -0x1e;
          }
          else {
            *(uint *)param_value = ((uint)minor & 0x3ff) << 0xc | (int)major << 0x16;
          }
        }
        if (param_value_size_ret != (size_t *)0x0) {
          *param_value_size_ret = 4;
        }
        *errorCode = cVar2;
      }
      else if (local_38 == (char *)0x0) {
        return bVar3;
      }
      operator_delete__(pcVar1);
      return bVar3;
    }
    break;
  case 0x907:
    if ((this->m_Config).Emulate_cl_khr_extended_versioning == true) {
      local_38 = (char *)0x0;
      allocateAndGetPlatformInfoString(this,platform,0x904,&local_38);
      pcVar1 = local_38;
      cVar2 = parseExtensionString
                        (local_38,(cl_name_version_khr *)param_value,param_value_size,
                         param_value_size_ret);
      *errorCode = cVar2;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      goto LAB_00171279;
    }
    break;
  default:
    if (param_name != 0x2036) {
      return false;
    }
    cVar2 = 0;
    if ((this->m_Config).Emulate_cl_khr_semaphore != true) {
      return false;
    }
    if (param_value != (void *)0x0) {
      if (param_value_size < 4) {
        cVar2 = -0x1e;
      }
      else {
        *(undefined4 *)param_value = 1;
      }
    }
    if (param_value_size_ret != (size_t *)0x0) {
      *param_value_size_ret = 4;
    }
    *errorCode = cVar2;
LAB_00171279:
    bVar3 = true;
    goto switchD_00171183_caseD_904;
  }
  bVar3 = false;
switchD_00171183_caseD_904:
  return bVar3;
}

Assistant:

bool CLIntercept::overrideGetPlatformInfo(
    cl_platform_id platform,
    cl_platform_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_PLATFORM_NAME:
        if( !m_Config.PlatformName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VENDOR:
        if( !m_Config.PlatformVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_PROFILE:
        if( !m_Config.PlatformProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VERSION:
        if( !m_Config.PlatformVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformVersion = NULL;

            errorCode = allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_VERSION,
                platformVersion );
            if( errorCode == CL_SUCCESS && platformVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        platformVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] platformVersion;
            platformVersion = NULL;
        }
        break;
    case CL_PLATFORM_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformExtensions = NULL;

            allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_EXTENSIONS,
                platformExtensions );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                platformExtensions,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] platformExtensions;
            platformExtensions = NULL;
        }
        break;
    case CL_PLATFORM_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}